

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GCTest.cpp
# Opt level: O0

void RunScope(int count)

{
  int iVar1;
  int in_EDI;
  int percent;
  int i;
  value_type *in_stack_ffffffffffffffb8;
  Table *in_stack_ffffffffffffffc0;
  String *in_stack_ffffffffffffffd0;
  undefined4 local_8;
  
  for (local_8 = 0; local_8 < in_EDI; local_8 = local_8 + 1) {
    iVar1 = RandomRange<int>(0,0x12511d);
    if (iVar1 < 0x10) {
      RandomValue(SUB81((ulong)in_stack_ffffffffffffffd0 >> 0x38,0));
    }
    else if (iVar1 < 0x15) {
      RandomFunction();
      std::deque<luna::Function_*,_std::allocator<luna::Function_*>_>::push_back
                ((deque<luna::Function_*,_std::allocator<luna::Function_*>_> *)
                 in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    }
    else if (iVar1 < 0x1f) {
      in_stack_ffffffffffffffd0 = RandomString();
      std::deque<luna::String_*,_std::allocator<luna::String_*>_>::push_back
                ((deque<luna::String_*,_std::allocator<luna::String_*>_> *)in_stack_ffffffffffffffc0
                 ,(value_type *)in_stack_ffffffffffffffb8);
    }
    else if (iVar1 < 0x29) {
      RandomClosure();
      std::deque<luna::Closure_*,_std::allocator<luna::Closure_*>_>::push_back
                ((deque<luna::Closure_*,_std::allocator<luna::Closure_*>_> *)
                 in_stack_ffffffffffffffc0,(value_type *)in_stack_ffffffffffffffb8);
    }
    else if (iVar1 < 0x33) {
      in_stack_ffffffffffffffc0 = RandomTable();
      std::deque<luna::Table_*,_std::allocator<luna::Table_*>_>::push_back
                ((deque<luna::Table_*,_std::allocator<luna::Table_*>_> *)in_stack_ffffffffffffffc0,
                 (value_type *)in_stack_ffffffffffffffb8);
    }
    else if (iVar1 < 0x38) {
      NewObjInGlobal();
    }
  }
  return;
}

Assistant:

void RunScope(int count)
{
    for (int i = 0; i < count; ++i)
    {
        int percent = RandomRange(1, 100);
        if (percent <= 15)
            RandomValue();
        else if (percent <= 20)
            g_globalFunction.push_back(RandomFunction());
        else if (percent <= 30)
            g_scopeString.push_back(RandomString());
        else if (percent <= 40)
            g_scopeClosure.push_back(RandomClosure());
        else if (percent <= 50)
            g_scopeTable.push_back(RandomTable());
        else if (percent <= 55)
            NewObjInGlobal();
    }
}